

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O1

vector<MPLSParser,_std::allocator<MPLSParser>_> * __thiscall
METADemuxer::getMplsInfo
          (vector<MPLSParser,_std::allocator<MPLSParser>_> *__return_storage_ptr__,METADemuxer *this
          ,string *mplsFileName)

{
  bool bVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  undefined4 *puVar4;
  pointer __k;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mplsFiles;
  MPLSParser parser;
  ostringstream ss;
  uint *local_290;
  undefined8 local_288;
  uint local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_270;
  MPLSParser local_258;
  string local_1a8 [11];
  
  (__return_storage_ptr__->super__Vector_base<MPLSParser,_std::allocator<MPLSParser>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<MPLSParser,_std::allocator<MPLSParser>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<MPLSParser,_std::allocator<MPLSParser>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  splitQuotedStr_abi_cxx11_(&local_270,(mplsFileName->_M_dataplus)._M_p,'+');
  if (local_270.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_270.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __k = local_270.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar2 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MPLSParser>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MPLSParser>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MPLSParser>_>_>
              ::find(&(this->m_mplsStreamMap)._M_t,__k);
      if ((_Rb_tree_header *)iVar2._M_node ==
          &(this->m_mplsStreamMap)._M_t._M_impl.super__Rb_tree_header) {
        MPLSParser::MPLSParser(&local_258);
        unquoteStr(local_1a8,__k);
        bVar1 = MPLSParser::parse(&local_258,local_1a8[0]._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
        if (!bVar1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Can\'t parse play list file ",0x1b);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(__k->_M_dataplus)._M_p,__k->_M_string_length);
          puVar4 = (undefined4 *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          *puVar4 = 3;
          *(undefined4 **)(puVar4 + 2) = puVar4 + 6;
          if (local_290 == &local_280) {
            puVar4[6] = local_280;
            puVar4[7] = uStack_27c;
            puVar4[8] = uStack_278;
            puVar4[9] = uStack_274;
          }
          else {
            *(uint **)(puVar4 + 2) = local_290;
            *(ulong *)(puVar4 + 6) = CONCAT44(uStack_27c,local_280);
          }
          *(undefined8 *)(puVar4 + 4) = local_288;
          local_280 = local_280 & 0xffffff00;
          __cxa_throw(puVar4,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
        }
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MPLSParser,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MPLSParser>_>_>
                 ::operator[](&this->m_mplsStreamMap,__k);
        pmVar3->is_different_audios = local_258.is_different_audios;
        pmVar3->is_seamless_angle_change = local_258.is_seamless_angle_change;
        *(undefined2 *)&pmVar3->field_0x12 = local_258._18_2_;
        pmVar3->m_chapterLen = local_258.m_chapterLen;
        pmVar3->IN_time = local_258.IN_time;
        pmVar3->OUT_time = local_258.OUT_time;
        pmVar3->PlayList_playback_type = local_258.PlayList_playback_type;
        pmVar3->playback_count = local_258.playback_count;
        pmVar3->number_of_SubPaths = local_258.number_of_SubPaths;
        pmVar3->is_multi_angle = local_258.is_multi_angle;
        pmVar3->ref_to_STC_id = local_258.ref_to_STC_id;
        pmVar3->PlayItem_random_access_flag = local_258.PlayItem_random_access_flag;
        pmVar3->number_of_angles = local_258.number_of_angles;
        std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>::operator=
                  (&pmVar3->m_playItems,&local_258.m_playItems);
        std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>::operator=
                  (&pmVar3->m_streamInfo,&local_258.m_streamInfo);
        std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>::operator=
                  (&pmVar3->m_streamInfoMVC,&local_258.m_streamInfoMVC);
        std::vector<PlayListMark,_std::allocator<PlayListMark>_>::operator=
                  (&pmVar3->m_marks,&local_258.m_marks);
        pmVar3->number_of_secondary_audio_stream_entries =
             local_258.number_of_secondary_audio_stream_entries;
        pmVar3->number_of_secondary_video_stream_entries =
             local_258.number_of_secondary_video_stream_entries;
        pmVar3->number_of_PiP_PG_textST_stream_entries_plus =
             local_258.number_of_PiP_PG_textST_stream_entries_plus;
        pmVar3->number_of_DolbyVision_video_stream_entries =
             local_258.number_of_DolbyVision_video_stream_entries;
        pmVar3->m_m2tsOffset = local_258.m_m2tsOffset;
        pmVar3->isDependStreamExist = local_258.isDependStreamExist;
        pmVar3->mvc_base_view_r = local_258.mvc_base_view_r;
        *(undefined2 *)&pmVar3->field_0x86 = local_258._134_2_;
        pmVar3->subPath_type = local_258.subPath_type;
        pmVar3->number_of_primary_video_stream_entries =
             local_258.number_of_primary_video_stream_entries;
        pmVar3->number_of_primary_audio_stream_entries =
             local_258.number_of_primary_audio_stream_entries;
        pmVar3->number_of_PG_textST_stream_entries = local_258.number_of_PG_textST_stream_entries;
        pmVar3->number_of_IG_stream_entries = local_258.number_of_IG_stream_entries;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&pmVar3->m_mvcFiles,&local_258.m_mvcFiles);
        std::vector<MPLSParser,_std::allocator<MPLSParser>_>::push_back
                  (__return_storage_ptr__,&local_258);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_258.m_mvcFiles);
        if (local_258.m_marks.super__Vector_base<PlayListMark,_std::allocator<PlayListMark>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_258.m_marks.
                          super__Vector_base<PlayListMark,_std::allocator<PlayListMark>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_258.m_marks.
                                super__Vector_base<PlayListMark,_std::allocator<PlayListMark>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_258.m_marks.
                                super__Vector_base<PlayListMark,_std::allocator<PlayListMark>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>::~vector
                  (&local_258.m_streamInfoMVC);
        std::vector<MPLSStreamInfo,_std::allocator<MPLSStreamInfo>_>::~vector
                  (&local_258.m_streamInfo);
        std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>::~vector(&local_258.m_playItems);
      }
      else {
        std::vector<MPLSParser,_std::allocator<MPLSParser>_>::push_back
                  (__return_storage_ptr__,(value_type *)(iVar2._M_node + 2));
      }
      __k = __k + 1;
    } while (__k != local_270.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_270);
  return __return_storage_ptr__;
}

Assistant:

std::vector<MPLSParser> METADemuxer::getMplsInfo(const string& mplsFileName)
{
    std::vector<MPLSParser> result;

    std::vector<std::string> mplsFiles = splitQuotedStr(mplsFileName.c_str(), '+');
    for (auto& i : mplsFiles)
    {
        auto itr = m_mplsStreamMap.find(i);
        if (itr != m_mplsStreamMap.end())
            result.push_back(itr->second);
        else
        {
            MPLSParser parser;
            if (!parser.parse(unquoteStr(i).c_str()))
                THROW(ERR_COMMON, "Can't parse play list file " << i)
            m_mplsStreamMap[i] = parser;
            result.push_back(parser);
        }
    }
    return result;
}